

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardCommon.cpp
# Opt level: O0

void leopard::xor_mem_2to1(void *x,void *y,void *z,uint64_t bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  __m128i x3_1;
  __m128i x2_1;
  __m128i x1_2;
  __m128i x0_2;
  __m128i *z16;
  __m128i *y16;
  __m128i *x16;
  __m256i x1_1;
  __m256i x0_1;
  __m256i x3;
  __m256i x2;
  __m256i x1;
  __m256i x0;
  __m256i *z32;
  __m256i *y32;
  __m256i *x32;
  ulong *local_838;
  ulong *local_830;
  ulong *local_828;
  ulong *local_758;
  ulong *local_750;
  ulong *local_748;
  ulong local_740;
  
  local_838 = in_RDX;
  local_830 = in_RSI;
  local_828 = in_RDI;
  local_758 = in_RDX;
  local_750 = in_RSI;
  local_748 = in_RDI;
  local_740 = in_RCX;
  if ((CpuHasAVX2 & 1) == 0) {
    do {
      uVar1 = local_830[1];
      uVar2 = local_838[1];
      uVar3 = local_830[2];
      uVar4 = local_830[3];
      uVar5 = local_838[2];
      uVar6 = local_838[3];
      uVar7 = local_830[4];
      uVar8 = local_830[5];
      uVar9 = local_838[4];
      uVar10 = local_838[5];
      uVar11 = local_830[6];
      uVar12 = local_830[7];
      uVar13 = local_838[6];
      uVar14 = local_838[7];
      *local_828 = *local_828 ^ *local_830 ^ *local_838;
      local_828[1] = local_828[1] ^ uVar1 ^ uVar2;
      local_828[2] = local_828[2] ^ uVar3 ^ uVar5;
      local_828[3] = local_828[3] ^ uVar4 ^ uVar6;
      local_828[4] = local_828[4] ^ uVar7 ^ uVar9;
      local_828[5] = local_828[5] ^ uVar8 ^ uVar10;
      local_828[6] = local_828[6] ^ uVar11 ^ uVar13;
      local_828[7] = local_828[7] ^ uVar12 ^ uVar14;
      local_828 = local_828 + 8;
      local_830 = local_830 + 8;
      local_838 = local_838 + 8;
      local_740 = local_740 - 0x40;
    } while (local_740 != 0);
  }
  else {
    for (; 0x7f < local_740; local_740 = local_740 - 0x80) {
      uVar1 = local_750[1];
      uVar2 = local_750[2];
      uVar3 = local_750[3];
      uVar4 = local_758[1];
      uVar5 = local_758[2];
      uVar6 = local_758[3];
      uVar7 = local_750[4];
      uVar8 = local_750[5];
      uVar9 = local_750[6];
      uVar10 = local_750[7];
      uVar11 = local_758[4];
      uVar12 = local_758[5];
      uVar13 = local_758[6];
      uVar14 = local_758[7];
      uVar15 = local_750[8];
      uVar16 = local_750[9];
      uVar17 = local_750[10];
      uVar18 = local_750[0xb];
      uVar19 = local_758[8];
      uVar20 = local_758[9];
      uVar21 = local_758[10];
      uVar22 = local_758[0xb];
      uVar23 = local_750[0xc];
      uVar24 = local_750[0xd];
      uVar25 = local_750[0xe];
      uVar26 = local_750[0xf];
      uVar27 = local_758[0xc];
      uVar28 = local_758[0xd];
      uVar29 = local_758[0xe];
      uVar30 = local_758[0xf];
      *local_748 = *local_748 ^ *local_750 ^ *local_758;
      local_748[1] = local_748[1] ^ uVar1 ^ uVar4;
      local_748[2] = local_748[2] ^ uVar2 ^ uVar5;
      local_748[3] = local_748[3] ^ uVar3 ^ uVar6;
      local_748[4] = local_748[4] ^ uVar7 ^ uVar11;
      local_748[5] = local_748[5] ^ uVar8 ^ uVar12;
      local_748[6] = local_748[6] ^ uVar9 ^ uVar13;
      local_748[7] = local_748[7] ^ uVar10 ^ uVar14;
      local_748[8] = local_748[8] ^ uVar15 ^ uVar19;
      local_748[9] = local_748[9] ^ uVar16 ^ uVar20;
      local_748[10] = local_748[10] ^ uVar17 ^ uVar21;
      local_748[0xb] = local_748[0xb] ^ uVar18 ^ uVar22;
      local_748[0xc] = local_748[0xc] ^ uVar23 ^ uVar27;
      local_748[0xd] = local_748[0xd] ^ uVar24 ^ uVar28;
      local_748[0xe] = local_748[0xe] ^ uVar25 ^ uVar29;
      local_748[0xf] = local_748[0xf] ^ uVar26 ^ uVar30;
      local_748 = local_748 + 0x10;
      local_750 = local_750 + 0x10;
      local_758 = local_758 + 0x10;
    }
    if (local_740 != 0) {
      uVar1 = local_750[1];
      uVar2 = local_750[2];
      uVar3 = local_750[3];
      uVar4 = local_758[1];
      uVar5 = local_758[2];
      uVar6 = local_758[3];
      uVar7 = local_750[4];
      uVar8 = local_750[5];
      uVar9 = local_750[6];
      uVar10 = local_750[7];
      uVar11 = local_758[4];
      uVar12 = local_758[5];
      uVar13 = local_758[6];
      uVar14 = local_758[7];
      *local_748 = *local_748 ^ *local_750 ^ *local_758;
      local_748[1] = local_748[1] ^ uVar1 ^ uVar4;
      local_748[2] = local_748[2] ^ uVar2 ^ uVar5;
      local_748[3] = local_748[3] ^ uVar3 ^ uVar6;
      local_748[4] = local_748[4] ^ uVar7 ^ uVar11;
      local_748[5] = local_748[5] ^ uVar8 ^ uVar12;
      local_748[6] = local_748[6] ^ uVar9 ^ uVar13;
      local_748[7] = local_748[7] ^ uVar10 ^ uVar14;
    }
  }
  return;
}

Assistant:

void xor_mem_2to1(
    void * LEO_RESTRICT x,
    const void * LEO_RESTRICT y,
    const void * LEO_RESTRICT z,
    uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        const LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<const LEO_M256 *>(y);
        const LEO_M256 * LEO_RESTRICT z32 = reinterpret_cast<const LEO_M256 *>(z);
        while (bytes >= 128)
        {
            LEO_M256 x0 = _mm256_xor_si256(_mm256_loadu_si256(x32), _mm256_loadu_si256(y32));
            x0 = _mm256_xor_si256(x0, _mm256_loadu_si256(z32));
            LEO_M256 x1 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 1), _mm256_loadu_si256(y32 + 1));
            x1 = _mm256_xor_si256(x1, _mm256_loadu_si256(z32 + 1));
            LEO_M256 x2 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 2), _mm256_loadu_si256(y32 + 2));
            x2 = _mm256_xor_si256(x2, _mm256_loadu_si256(z32 + 2));
            LEO_M256 x3 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 3), _mm256_loadu_si256(y32 + 3));
            x3 = _mm256_xor_si256(x3, _mm256_loadu_si256(z32 + 3));
            _mm256_storeu_si256(x32, x0);
            _mm256_storeu_si256(x32 + 1, x1);
            _mm256_storeu_si256(x32 + 2, x2);
            _mm256_storeu_si256(x32 + 3, x3);
            x32 += 4, y32 += 4, z32 += 4;
            bytes -= 128;
        };

        if (bytes > 0)
        {
            LEO_M256 x0 = _mm256_xor_si256(_mm256_loadu_si256(x32),     _mm256_loadu_si256(y32));
            x0 = _mm256_xor_si256(x0, _mm256_loadu_si256(z32));
            LEO_M256 x1 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 1), _mm256_loadu_si256(y32 + 1));
            x1 = _mm256_xor_si256(x1, _mm256_loadu_si256(z32 + 1));
            _mm256_storeu_si256(x32, x0);
            _mm256_storeu_si256(x32 + 1, x1);
        }

        return;
    }
#endif // LEO_TRY_AVX2

    LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
    const LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<const LEO_M128 *>(y);
    const LEO_M128 * LEO_RESTRICT z16 = reinterpret_cast<const LEO_M128 *>(z);
    do
    {
        LEO_M128 x0 = _mm_xor_si128(_mm_loadu_si128(x16), _mm_loadu_si128(y16));
        x0 = _mm_xor_si128(x0, _mm_loadu_si128(z16));
        LEO_M128 x1 = _mm_xor_si128(_mm_loadu_si128(x16 + 1), _mm_loadu_si128(y16 + 1));
        x1 = _mm_xor_si128(x1, _mm_loadu_si128(z16 + 1));
        LEO_M128 x2 = _mm_xor_si128(_mm_loadu_si128(x16 + 2), _mm_loadu_si128(y16 + 2));
        x2 = _mm_xor_si128(x2, _mm_loadu_si128(z16 + 2));
        LEO_M128 x3 = _mm_xor_si128(_mm_loadu_si128(x16 + 3), _mm_loadu_si128(y16 + 3));
        x3 = _mm_xor_si128(x3, _mm_loadu_si128(z16 + 3));
        _mm_storeu_si128(x16, x0);
        _mm_storeu_si128(x16 + 1, x1);
        _mm_storeu_si128(x16 + 2, x2);
        _mm_storeu_si128(x16 + 3, x3);
        x16 += 4, y16 += 4, z16 += 4;
        bytes -= 64;
    } while (bytes > 0);
}